

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

uint __thiscall
crnlib::command_line_params::find
          (command_line_params *this,uint num_keys,char **ppKeys,
          vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          *pIterators,vector<unsigned_int> *pUnmatched_indices)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  pointer ppVar5;
  command_line_params *in_RCX;
  long in_RDX;
  uint in_ESI;
  vector<crnlib::dynamic_string> *in_RDI;
  vector<unsigned_int> *in_R8;
  int k;
  param_map_const_iterator end;
  param_map_const_iterator begin;
  char *pKey;
  uint i_1;
  uint n;
  uint i;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  *in_stack_ffffffffffffff78;
  vector<unsigned_int> *in_stack_ffffffffffffff80;
  vector<unsigned_int> *this_00;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  vector<unsigned_int> *in_stack_ffffffffffffff90;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_50;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_48;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar6;
  uint in_stack_ffffffffffffffd4;
  vector<unsigned_int> *this_01;
  
  this_01 = in_R8;
  if (in_R8 != (vector<unsigned_int> *)0x0) {
    vector<crnlib::dynamic_string>::size(in_RDI);
    vector<unsigned_int>::resize
              (in_R8,in_stack_ffffffffffffff8c,SUB41(in_stack_ffffffffffffff88 >> 0x18,0));
    in_stack_ffffffffffffff8c = 0;
    while (in_stack_ffffffffffffffd4 = in_stack_ffffffffffffff8c,
          uVar2 = vector<crnlib::dynamic_string>::size(in_RDI), in_stack_ffffffffffffff90 = in_R8,
          in_stack_ffffffffffffff8c < uVar2) {
      uVar2 = in_stack_ffffffffffffffd4;
      puVar4 = vector<unsigned_int>::operator[](this_01,in_stack_ffffffffffffffd4);
      *puVar4 = in_stack_ffffffffffffffd4;
      in_stack_ffffffffffffff8c = uVar2 + 1;
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffffd4;
    }
  }
  uVar2 = 0;
  for (uVar6 = 0; uVar6 < in_ESI; uVar6 = uVar6 + 1) {
    local_40 = *(undefined8 *)(in_RDX + (ulong)uVar6 * 8);
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator(&local_48);
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator(&local_50);
    find(in_RCX,(char *)this_01,
         (param_map_const_iterator *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),
         (param_map_const_iterator *)CONCAT44(uVar6,in_stack_ffffffffffffffc8));
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      this_00 = this_01;
      if (in_RCX != (command_line_params *)0x0) {
        vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
        ::push_back((vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
                     *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        this_00 = this_01;
      }
      this_01 = this_00;
      if (this_00 != (vector<unsigned_int> *)0x0) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                               *)this_00);
        iVar3 = vector<unsigned_int>::find(this_00,&(ppVar5->second).m_index);
        in_stack_ffffffffffffff80 = this_00;
        if (-1 < iVar3) {
          vector<unsigned_int>::erase_unordered(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
          ;
          in_stack_ffffffffffffff80 = this_00;
        }
      }
      uVar2 = uVar2 + 1;
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    }
  }
  return uVar2;
}

Assistant:

uint command_line_params::find(uint num_keys, const char** ppKeys, crnlib::vector<param_map_const_iterator>* pIterators, crnlib::vector<uint>* pUnmatched_indices) const {
  CRNLIB_ASSERT(ppKeys);

  if (pUnmatched_indices) {
    pUnmatched_indices->resize(m_params.size());
    for (uint i = 0; i < m_params.size(); i++)
      (*pUnmatched_indices)[i] = i;
  }

  uint n = 0;
  for (uint i = 0; i < num_keys; i++) {
    const char* pKey = ppKeys[i];

    param_map_const_iterator begin, end;
    find(pKey, begin, end);

    while (begin != end) {
      if (pIterators)
        pIterators->push_back(begin);

      if (pUnmatched_indices) {
        int k = pUnmatched_indices->find(begin->second.m_index);
        if (k >= 0)
          pUnmatched_indices->erase_unordered(k);
      }

      n++;
      begin++;
    }
  }

  return n;
}